

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void internalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    ExternalID_local = name;
    if (name == (xmlChar *)0x0) {
      ExternalID_local = "(null)";
    }
    fprintf((FILE *)SAXdebug,"SAX.internalSubset(%s,",ExternalID_local);
    if (ExternalID == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug," ,");
    }
    else {
      fprintf((FILE *)SAXdebug," %s,",ExternalID);
    }
    if (SystemID == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug," )\n");
    }
    else {
      fprintf((FILE *)SAXdebug," %s)\n",SystemID);
    }
  }
  return;
}

Assistant:

static void
internalSubsetDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    callbacks++;
    if (quiet)
	return;
    if (name == NULL)
        name = BAD_CAST "(null)";
    fprintf(SAXdebug, "SAX.internalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(SAXdebug, " ,");
    else
	fprintf(SAXdebug, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(SAXdebug, " )\n");
    else
	fprintf(SAXdebug, " %s)\n", SystemID);
}